

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_8.cpp
# Opt level: O3

bool judge(int x)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  
  if (x == 0) {
    iVar1 = 0;
  }
  else {
    piVar2 = digital;
    iVar1 = 0;
    do {
      *piVar2 = x % 10;
      uVar3 = x + 9;
      piVar2 = piVar2 + 1;
      iVar1 = iVar1 + 1;
      x = x / 10;
    } while (0x12 < uVar3);
  }
  return digital[0] == (&DAT_0010504c)[iVar1];
}

Assistant:

bool judge(int x)
{

    int m=0;
    while(x)   //把x一位一位的向digital数组中存
    {
        digital[m++] = x % 10;
        x /= 10;
    }                                               //比较前半边与后半边的数是否相等，不论x是偶数还是奇数，
    for (int i = 0; i < m / 2; ++i) {               //都除以二(m是int类型，除二取小数点前整数。为基数时如12321，就只用比较前两位和后两位； 为偶数时如123321，就比较前三位和后三位)
        if(digital[i] != digital[m - 1 - i])        //为什么是 m-1-i？ --->  是因为下标i的取值范围是0到m-1， 第i个对应末尾就是 （m-1）-i 的个
            return false;
        else
            return true;
    }
}